

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_hash(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlHashTablePtr pxVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlHashTablePtr pxVar12;
  xmlChar *pxVar13;
  xmlChar *pxVar14;
  xmlChar *pxVar15;
  uint uVar16;
  uint no;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int *piVar17;
  code *pcVar18;
  xmlHashTablePtr in_RSI;
  int test_ret;
  int iVar19;
  uint no_00;
  ulong uVar20;
  int n_table_2;
  ulong uVar21;
  int iVar22;
  int n_table;
  uint uVar23;
  uint uVar24;
  int local_7c;
  int test_ret_1;
  int local_64;
  int test_ret_2;
  uint local_4c;
  int local_48;
  int local_44;
  int local_40;
  
  if (quiet == '\0') {
    puts("Testing hash : 17 of 25 functions ...");
  }
  iVar22 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    uVar20 = 0;
    while (iVar19 = (int)uVar20, iVar19 != 5) {
      pxVar12 = (xmlHashTablePtr)0x0;
      while (iVar7 = (int)pxVar12, iVar7 != 3) {
        iVar1 = xmlMemBlocks();
        iVar2 = (int)in_RSI;
        pxVar9 = gen_xmlHashTablePtr(uVar23,iVar2);
        in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar19,iVar2);
        piVar17 = &call_tests;
        if (iVar7 != 0) {
          if (iVar7 == 1) {
            piVar17 = (int *)0xffffffffffffffff;
          }
          else {
            piVar17 = (int *)0x0;
          }
        }
        xmlHashAddEntry(pxVar9,in_RSI,piVar17);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr((int)pxVar9,in_RSI,nr);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashAddEntry",(ulong)(uint)(iVar2 - iVar1));
          iVar22 = iVar22 + 1;
          printf(" %d",(ulong)uVar23);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar12;
        }
        pxVar12 = (xmlHashTablePtr)(ulong)(iVar7 + 1);
      }
      uVar20 = (ulong)(iVar19 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
        pxVar12 = (xmlHashTablePtr)0x0;
        while (iVar7 = (int)pxVar12, iVar7 != 3) {
          iVar1 = xmlMemBlocks();
          iVar2 = (int)in_RSI;
          pxVar9 = gen_xmlHashTablePtr(uVar23,iVar2);
          in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,iVar2);
          pxVar10 = gen_const_xmlChar_ptr(uVar16,iVar2);
          piVar17 = &call_tests;
          if (iVar7 != 0) {
            if (iVar7 == 1) {
              piVar17 = (int *)0xffffffffffffffff;
            }
            else {
              piVar17 = (int *)0x0;
            }
          }
          xmlHashAddEntry2(pxVar9,in_RSI,pxVar10,piVar17);
          call_tests = call_tests + 1;
          des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_00);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashAddEntry2",(ulong)(uint)(iVar2 - iVar1));
            iVar19 = iVar19 + 1;
            printf(" %d",(ulong)uVar23);
            printf(" %d",(ulong)uVar3);
            printf(" %d",(ulong)uVar16);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar12;
          }
          pxVar12 = (xmlHashTablePtr)(ulong)(iVar7 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
      for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
        for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
          pxVar12 = (xmlHashTablePtr)0x0;
          while (iVar2 = (int)pxVar12, iVar2 != 3) {
            iVar4 = xmlMemBlocks();
            iVar5 = (int)in_RSI;
            pxVar9 = gen_xmlHashTablePtr(uVar23,iVar5);
            in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar1,iVar5);
            pxVar10 = gen_const_xmlChar_ptr(uVar3,iVar5);
            pxVar11 = gen_const_xmlChar_ptr(uVar16,iVar5);
            piVar17 = &call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                piVar17 = (int *)0xffffffffffffffff;
              }
              else {
                piVar17 = (int *)0x0;
              }
            }
            xmlHashAddEntry3(pxVar9,in_RSI,pxVar10,pxVar11,piVar17);
            call_tests = call_tests + 1;
            des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_01);
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashAddEntry3",(ulong)(uint)(iVar5 - iVar4));
              iVar7 = iVar7 + 1;
              printf(" %d",(ulong)uVar23);
              printf(" %d",iVar1);
              printf(" %d",(ulong)uVar3);
              printf(" %d",(ulong)uVar16);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar12;
            }
            pxVar12 = (xmlHashTablePtr)(ulong)(iVar2 + 1);
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,(int)in_RSI);
      xmlHashDefaultDeallocator(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashDefaultDeallocator",(ulong)(uint)(iVar2 - iVar1));
        local_7c = local_7c + 1;
        printf(" %d",(ulong)uVar23);
        in_RSI = (xmlHashTablePtr)(ulong)uVar3;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar20 = 0;
  while (iVar1 = (int)uVar20, iVar1 != 2) {
    for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
      iVar2 = xmlMemBlocks();
      iVar4 = (int)in_RSI;
      pxVar12 = gen_xmlHashTablePtr(iVar1,iVar4);
      in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar23,iVar4);
      xmlHashLookup(pxVar12);
      call_tests = call_tests + 1;
      des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_02);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar2 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashLookup",(ulong)(uint)(iVar4 - iVar2));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",uVar20);
        in_RSI = (xmlHashTablePtr)(ulong)uVar23;
        printf(" %d");
        putchar(10);
      }
    }
    uVar20 = (ulong)(iVar1 + 1);
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      pxVar12 = (xmlHashTablePtr)0x0;
      while (iVar2 = (int)pxVar12, iVar2 != 5) {
        iVar4 = xmlMemBlocks();
        iVar5 = (int)in_RSI;
        pxVar9 = gen_xmlHashTablePtr(uVar23,iVar5);
        in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,iVar5);
        pxVar10 = gen_const_xmlChar_ptr(iVar2,iVar5);
        xmlHashLookup2(pxVar9,in_RSI,pxVar10);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_03);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashLookup2",(ulong)(uint)(iVar5 - iVar4));
          iVar1 = iVar1 + 1;
          printf(" %d",(ulong)uVar23);
          printf(" %d",(ulong)uVar3);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar12;
        }
        pxVar12 = (xmlHashTablePtr)(ulong)(iVar2 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
        pxVar12 = (xmlHashTablePtr)0x0;
        while (iVar4 = (int)pxVar12, iVar4 != 5) {
          iVar5 = xmlMemBlocks();
          iVar6 = (int)in_RSI;
          pxVar9 = gen_xmlHashTablePtr(uVar23,iVar6);
          in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,iVar6);
          pxVar10 = gen_const_xmlChar_ptr(uVar16,iVar6);
          gen_const_xmlChar_ptr(iVar4,iVar6);
          xmlHashLookup3(pxVar9,in_RSI,pxVar10);
          call_tests = call_tests + 1;
          des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_04);
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashLookup3",(ulong)(uint)(iVar6 - iVar5));
            iVar2 = iVar2 + 1;
            printf(" %d",(ulong)uVar23);
            printf(" %d",(ulong)uVar3);
            printf(" %d",(ulong)uVar16);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar12;
          }
          pxVar12 = (xmlHashTablePtr)(ulong)(iVar4 + 1);
        }
      }
    }
  }
  iVar22 = iVar19 + iVar22 + iVar7 + local_7c + test_ret_1;
  function_tests = function_tests + 1;
  local_48 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
        iVar19 = xmlMemBlocks();
        iVar7 = (int)in_RSI;
        pxVar12 = gen_xmlHashTablePtr(uVar23,iVar7);
        in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,iVar7);
        pxVar10 = gen_const_xmlChar_ptr(uVar16,iVar7);
        xmlHashQLookup(pxVar12,in_RSI,pxVar10);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_05);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar19 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashQLookup",(ulong)(uint)(iVar7 - iVar19));
          local_48 = local_48 + 1;
          printf(" %d",(ulong)uVar23);
          printf(" %d",(ulong)uVar3);
          in_RSI = (xmlHashTablePtr)(ulong)uVar16;
          printf(" %d");
          putchar(10);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (iVar19 = 0; iVar19 != 2; iVar19 = iVar19 + 1) {
    for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
      for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
        for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
          pxVar12 = (xmlHashTablePtr)0x0;
          while (iVar4 = (int)pxVar12, iVar4 != 5) {
            iVar5 = xmlMemBlocks();
            iVar6 = (int)in_RSI;
            pxVar9 = gen_xmlHashTablePtr(iVar19,iVar6);
            in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar7,iVar6);
            pxVar10 = gen_const_xmlChar_ptr(uVar23,iVar6);
            pxVar11 = gen_const_xmlChar_ptr(uVar3,iVar6);
            pxVar13 = gen_const_xmlChar_ptr(iVar4,iVar6);
            xmlHashQLookup2(pxVar9,in_RSI,pxVar10,pxVar11,pxVar13);
            call_tests = call_tests + 1;
            des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_06);
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashQLookup2",(ulong)(uint)(iVar6 - iVar5));
              local_44 = local_44 + 1;
              printf(" %d",iVar19);
              printf(" %d",iVar7);
              printf(" %d",(ulong)uVar23);
              printf(" %d",(ulong)uVar3);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar12;
            }
            pxVar12 = (xmlHashTablePtr)(ulong)(iVar4 + 1);
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
        for (local_4c = 0; local_4c != 5; local_4c = local_4c + 1) {
          for (uVar24 = 0; uVar24 != 5; uVar24 = uVar24 + 1) {
            for (no_00 = 0; no_00 != 5; no_00 = no_00 + 1) {
              for (no = 0; no != 5; no = no + 1) {
                iVar19 = xmlMemBlocks();
                iVar7 = (int)in_RSI;
                pxVar12 = gen_xmlHashTablePtr(uVar23,iVar7);
                in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar3,iVar7);
                pxVar10 = gen_const_xmlChar_ptr(uVar16,iVar7);
                pxVar11 = gen_const_xmlChar_ptr(local_4c,iVar7);
                pxVar13 = gen_const_xmlChar_ptr(uVar24,iVar7);
                pxVar14 = gen_const_xmlChar_ptr(no_00,iVar7);
                pxVar15 = gen_const_xmlChar_ptr(no,iVar7);
                xmlHashQLookup3(pxVar12,in_RSI,pxVar10,pxVar11,pxVar13,pxVar14,pxVar15);
                call_tests = call_tests + 1;
                des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_07);
                xmlResetLastError();
                iVar7 = xmlMemBlocks();
                if (iVar19 != iVar7) {
                  iVar7 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlHashQLookup3",(ulong)(uint)(iVar7 - iVar19))
                  ;
                  local_40 = local_40 + 1;
                  printf(" %d",(ulong)uVar23);
                  printf(" %d",(ulong)uVar3);
                  printf(" %d",(ulong)uVar16);
                  printf(" %d",(ulong)local_4c);
                  printf(" %d",(ulong)uVar24);
                  printf(" %d",(ulong)no_00);
                  in_RSI = (xmlHashTablePtr)(ulong)no;
                  printf(" %d");
                  putchar(10);
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar20 = 0;
  while (iVar19 = (int)uVar20, iVar19 != 2) {
    for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
      for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
        iVar7 = xmlMemBlocks();
        iVar4 = (int)in_RSI;
        pxVar12 = gen_xmlHashTablePtr(iVar19,iVar4);
        in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar23,iVar4);
        pcVar18 = (code *)0x0;
        if (uVar3 == 0) {
          pcVar18 = test_xmlHashDeallocator;
        }
        xmlHashRemoveEntry(pxVar12,in_RSI,pcVar18);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_08);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar7 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashRemoveEntry",(ulong)(uint)(iVar4 - iVar7));
          local_64 = local_64 + 1;
          printf(" %d",uVar20);
          printf(" %d",(ulong)uVar23);
          in_RSI = (xmlHashTablePtr)(ulong)uVar3;
          printf(" %d");
          putchar(10);
        }
      }
    }
    uVar20 = (ulong)(iVar19 + 1);
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar20 = 0;
  while (iVar19 = (int)uVar20, iVar19 != 2) {
    for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
      for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
        pxVar12 = (xmlHashTablePtr)0x0;
        while (iVar7 = (int)pxVar12, iVar7 != 2) {
          iVar4 = xmlMemBlocks();
          iVar5 = (int)in_RSI;
          pxVar9 = gen_xmlHashTablePtr(iVar19,iVar5);
          in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar23,iVar5);
          pxVar10 = gen_const_xmlChar_ptr(uVar3,iVar5);
          xmlHashRemoveEntry2(pxVar9,in_RSI,pxVar10);
          call_tests = call_tests + 1;
          des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_09);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashRemoveEntry2",(ulong)(uint)(iVar5 - iVar4));
            test_ret_1 = test_ret_1 + 1;
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar23);
            printf(" %d",(ulong)uVar3);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar12;
          }
          pxVar12 = (xmlHashTablePtr)(ulong)(iVar7 + 1);
        }
      }
    }
    uVar20 = (ulong)(iVar19 + 1);
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
      for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
        for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
          pxVar12 = (xmlHashTablePtr)0x0;
          while (iVar5 = (int)pxVar12, iVar5 != 2) {
            iVar6 = xmlMemBlocks();
            iVar8 = (int)in_RSI;
            pxVar9 = gen_xmlHashTablePtr(iVar7,iVar8);
            in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar4,iVar8);
            pxVar10 = gen_const_xmlChar_ptr(uVar23,iVar8);
            pxVar11 = gen_const_xmlChar_ptr(uVar3,iVar8);
            pcVar18 = (code *)0x0;
            if (iVar5 == 0) {
              pcVar18 = test_xmlHashDeallocator;
            }
            xmlHashRemoveEntry3(pxVar9,in_RSI,pxVar10,pxVar11,pcVar18);
            call_tests = call_tests + 1;
            des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_10);
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar6 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashRemoveEntry3",(ulong)(uint)(iVar8 - iVar6));
              iVar19 = iVar19 + 1;
              printf(" %d",iVar7);
              printf(" %d",iVar4);
              printf(" %d",(ulong)uVar23);
              printf(" %d",(ulong)uVar3);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar12;
            }
            pxVar12 = (xmlHashTablePtr)(ulong)(iVar5 + 1);
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    iVar7 = xmlMemBlocks();
    pxVar12 = gen_xmlHashTablePtr(uVar23,(int)in_RSI);
    xmlHashSize(pxVar12);
    call_tests = call_tests + 1;
    des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_11);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar7 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHashSize",(ulong)(uint)(iVar4 - iVar7));
      test_ret_2 = test_ret_2 + 1;
      in_RSI = (xmlHashTablePtr)(ulong)uVar23;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar22 = iVar22 + iVar1 + iVar2 + local_48 + local_44 + local_40 + local_64 + test_ret_1;
  local_64 = 0;
  uVar20 = 0;
  while (iVar7 = (int)uVar20, iVar7 != 2) {
    for (uVar23 = 0; uVar23 != 5; uVar23 = uVar23 + 1) {
      uVar21 = 0;
      while (iVar1 = (int)uVar21, iVar1 != 3) {
        pxVar12 = (xmlHashTablePtr)0x0;
        while( true ) {
          iVar4 = (int)in_RSI;
          iVar2 = (int)pxVar12;
          if (iVar2 == 2) break;
          iVar5 = xmlMemBlocks();
          pxVar9 = gen_xmlHashTablePtr(iVar7,iVar4);
          in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(uVar23,iVar4);
          piVar17 = &call_tests;
          if (iVar1 != 0) {
            if (iVar1 == 1) {
              piVar17 = (int *)0xffffffffffffffff;
            }
            else {
              piVar17 = (int *)0x0;
            }
          }
          xmlHashUpdateEntry(pxVar9,in_RSI,piVar17);
          call_tests = call_tests + 1;
          des_xmlHashTablePtr((int)pxVar9,in_RSI,nr_12);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar5 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashUpdateEntry",(ulong)(uint)(iVar4 - iVar5));
            local_64 = local_64 + 1;
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar23);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar12;
          }
          pxVar12 = (xmlHashTablePtr)(ulong)(iVar2 + 1);
        }
        uVar21 = (ulong)(iVar1 + 1);
      }
    }
    uVar20 = (ulong)(iVar7 + 1);
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
      for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
        for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
          for (uVar24 = 0; iVar1 = (int)in_RSI, uVar24 != 2; uVar24 = uVar24 + 1) {
            iVar2 = xmlMemBlocks();
            pxVar12 = gen_xmlHashTablePtr(uVar23,iVar1);
            in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar7,iVar1);
            pxVar10 = gen_const_xmlChar_ptr(uVar3,iVar1);
            piVar17 = &call_tests;
            if (uVar16 != 0) {
              if (uVar16 == 1) {
                piVar17 = (int *)0xffffffffffffffff;
              }
              else {
                piVar17 = (int *)0x0;
              }
            }
            pcVar18 = (code *)0x0;
            if (uVar24 == 0) {
              pcVar18 = test_xmlHashDeallocator;
            }
            xmlHashUpdateEntry2(pxVar12,in_RSI,pxVar10,piVar17,pcVar18);
            call_tests = call_tests + 1;
            des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_13);
            xmlResetLastError();
            iVar1 = xmlMemBlocks();
            if (iVar2 != iVar1) {
              iVar1 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashUpdateEntry2",(ulong)(uint)(iVar1 - iVar2));
              test_ret_1 = test_ret_1 + 1;
              printf(" %d",(ulong)uVar23);
              printf(" %d",iVar7);
              printf(" %d",(ulong)uVar3);
              printf(" %d",(ulong)uVar16);
              in_RSI = (xmlHashTablePtr)(ulong)uVar24;
              printf(" %d");
              putchar(10);
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
    for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
        for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
          for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
            for (uVar24 = 0; iVar4 = (int)in_RSI, uVar24 != 2; uVar24 = uVar24 + 1) {
              iVar5 = xmlMemBlocks();
              pxVar12 = gen_xmlHashTablePtr(uVar23,iVar4);
              in_RSI = (xmlHashTablePtr)gen_const_xmlChar_ptr(iVar1,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(iVar2,iVar4);
              pxVar11 = gen_const_xmlChar_ptr(uVar3,iVar4);
              piVar17 = &call_tests;
              if (uVar16 != 0) {
                if (uVar16 == 1) {
                  piVar17 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar17 = (int *)0x0;
                }
              }
              pcVar18 = (code *)0x0;
              if (uVar24 == 0) {
                pcVar18 = test_xmlHashDeallocator;
              }
              xmlHashUpdateEntry3(pxVar12,in_RSI,pxVar10,pxVar11,piVar17,pcVar18);
              call_tests = call_tests + 1;
              des_xmlHashTablePtr((int)pxVar12,in_RSI,nr_14);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar5 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlHashUpdateEntry3",(ulong)(uint)(iVar4 - iVar5)
                      );
                iVar7 = iVar7 + 1;
                printf(" %d",(ulong)uVar23);
                printf(" %d",iVar1);
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar3);
                printf(" %d",(ulong)uVar16);
                in_RSI = (xmlHashTablePtr)(ulong)uVar24;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  uVar23 = iVar22 + iVar19 + test_ret_2 + local_64 + test_ret_1 + iVar7;
  if (uVar23 != 0) {
    printf("Module hash: %d errors\n",(ulong)uVar23);
  }
  return uVar23;
}

Assistant:

static int
test_hash(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing hash : 17 of 25 functions ...\n");
    test_ret += test_xmlHashAddEntry();
    test_ret += test_xmlHashAddEntry2();
    test_ret += test_xmlHashAddEntry3();
    test_ret += test_xmlHashCopy();
    test_ret += test_xmlHashCreate();
    test_ret += test_xmlHashCreateDict();
    test_ret += test_xmlHashDefaultDeallocator();
    test_ret += test_xmlHashLookup();
    test_ret += test_xmlHashLookup2();
    test_ret += test_xmlHashLookup3();
    test_ret += test_xmlHashQLookup();
    test_ret += test_xmlHashQLookup2();
    test_ret += test_xmlHashQLookup3();
    test_ret += test_xmlHashRemoveEntry();
    test_ret += test_xmlHashRemoveEntry2();
    test_ret += test_xmlHashRemoveEntry3();
    test_ret += test_xmlHashScan();
    test_ret += test_xmlHashScan3();
    test_ret += test_xmlHashScanFull();
    test_ret += test_xmlHashScanFull3();
    test_ret += test_xmlHashSize();
    test_ret += test_xmlHashUpdateEntry();
    test_ret += test_xmlHashUpdateEntry2();
    test_ret += test_xmlHashUpdateEntry3();

    if (test_ret != 0)
	printf("Module hash: %d errors\n", test_ret);
    return(test_ret);
}